

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

MOJOSHADER_glProgram *
MOJOSHADER_glLinkProgram(MOJOSHADER_glShader *vshader,MOJOSHADER_glShader *pshader)

{
  uint uVar1;
  MOJOSHADER_parseData *pMVar2;
  int *piVar3;
  GLuint GVar4;
  int iVar5;
  MOJOSHADER_glProgram *program;
  UniformMap *__s;
  AttributeMap *pAVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  size_t len;
  MOJOSHADER_attribute *pMVar11;
  int bound;
  int local_40;
  GLuint local_3c;
  GLint (*local_38) [10];
  
  local_40 = 0;
  if (vshader == (MOJOSHADER_glShader *)0x0 && pshader == (MOJOSHADER_glShader *)0x0) {
    return (MOJOSHADER_glProgram *)0x0;
  }
  GVar4 = (*ctx->profileLinkProgram)(vshader,pshader);
  if (GVar4 == 0) {
    return (MOJOSHADER_glProgram *)0x0;
  }
  program = (MOJOSHADER_glProgram *)Malloc(0x2e8);
  if (program == (MOJOSHADER_glProgram *)0x0) {
    (*ctx->profileDeleteProgram)(GVar4);
    return (MOJOSHADER_glProgram *)0x0;
  }
  uVar9 = 0;
  memset(program,0,0x2e8);
  local_38 = program->vertex_attrib_loc;
  memset(local_38,0xff,0x230);
  if (vshader != (MOJOSHADER_glShader *)0x0) {
    uVar9 = vshader->parseData->uniform_count;
  }
  if (pshader != (MOJOSHADER_glShader *)0x0) {
    uVar9 = uVar9 + pshader->parseData->uniform_count;
  }
  if (0 < (int)uVar9) {
    __s = (UniformMap *)Malloc((ulong)uVar9 * 0x18);
    program->uniforms = __s;
    if (__s == (UniformMap *)0x0) goto LAB_00121d07;
    memset(__s,0,(ulong)uVar9 * 0x18);
  }
  program->handle = GVar4;
  program->vertex = vshader;
  program->fragment = pshader;
  program->generation = ctx->generation - 1;
  program->refcount = 1;
  if (vshader != (MOJOSHADER_glShader *)0x0) {
    lVar10 = (long)vshader->parseData->attribute_count;
    local_3c = GVar4;
    if (0 < lVar10) {
      len = lVar10 << 4;
      pAVar6 = (AttributeMap *)Malloc(len);
      program->attributes = pAVar6;
      GVar4 = local_3c;
      if (pAVar6 == (AttributeMap *)0x0) goto LAB_00121d07;
      memset(pAVar6,0,len);
      pMVar2 = program->vertex->parseData;
      pMVar11 = pMVar2->attributes;
      for (lVar10 = 0; lVar10 < pMVar2->attribute_count; lVar10 = lVar10 + 1) {
        uVar9 = (*ctx->profileGetAttribLocation)(program,(int)lVar10);
        if (-1 < (int)uVar9) {
          pAVar6 = program->attributes;
          uVar1 = program->attribute_count;
          pAVar6[uVar1].attribute = pMVar11;
          pAVar6[uVar1].location = uVar9;
          local_38[pMVar11->usage][pMVar11->index] = uVar9;
          program->attribute_count = program->attribute_count + 1;
          if (0x20 < uVar9) {
            __assert_fail("0 && \"Static array is too small.\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x71f,"int lookup_attributes(MOJOSHADER_glProgram *)");
          }
        }
        pMVar11 = pMVar11 + 1;
      }
    }
    iVar5 = lookup_uniforms(program,vshader,&local_40);
    GVar4 = local_3c;
    if (iVar5 == 0) goto LAB_00121d07;
    lookup_samplers(program,vshader,&local_40);
    lookup_outputs(program,pshader);
    vshader->refcount = vshader->refcount + 1;
  }
  if (pshader != (MOJOSHADER_glShader *)0x0) {
    iVar5 = lookup_uniforms(program,pshader,&local_40);
    if (iVar5 == 0) {
LAB_00121d07:
      Free(program->vs_uniforms_float4);
      Free(program->vs_uniforms_int4);
      Free(program->vs_uniforms_bool);
      Free(program->ps_uniforms_float4);
      Free(program->ps_uniforms_int4);
      Free(program->ps_uniforms_bool);
      Free(program->uniforms);
      Free(program->attributes);
      (*ctx->free_fn)(program,ctx->malloc_data);
      iVar5 = local_40;
      (*ctx->profileDeleteProgram)(GVar4);
      if (iVar5 != 0) {
        (*ctx->profileUseProgram)(ctx->bound_program);
      }
      return (MOJOSHADER_glProgram *)0x0;
    }
    lookup_samplers(program,pshader,&local_40);
    lookup_outputs(program,pshader);
    pshader->refcount = pshader->refcount + 1;
  }
  uVar7 = 0;
  uVar8 = (ulong)program->uniform_count;
  if ((int)program->uniform_count < 1) {
    uVar8 = uVar7;
  }
  while( true ) {
    if (uVar8 * 0x18 - uVar7 == 0) {
      if (local_40 != 0) {
        (*ctx->profileUseProgram)(ctx->bound_program);
      }
      (*ctx->profileFinalInitProgram)(program);
      return program;
    }
    piVar3 = *(int **)((long)&program->uniforms->uniform + uVar7);
    if (piVar3[3] != 0) break;
    if ((piVar3[2] != 0) && (*piVar3 != 0)) {
      __assert_fail("u->type == MOJOSHADER_UNIFORM_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x73c,"int build_constants_lists(MOJOSHADER_glProgram *)");
    }
    uVar7 = uVar7 + 0x18;
  }
  __assert_fail("!u->constant",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                ,0x736,"int build_constants_lists(MOJOSHADER_glProgram *)");
}

Assistant:

MOJOSHADER_glProgram *MOJOSHADER_glLinkProgram(MOJOSHADER_glShader *vshader,
                                               MOJOSHADER_glShader *pshader)
{
    int bound = 0;

    if ((vshader == NULL) && (pshader == NULL))
        return NULL;

    int numregs = 0;
    MOJOSHADER_glProgram *retval = NULL;
    const GLuint program = ctx->profileLinkProgram(vshader, pshader);
    if (program == 0)
        goto link_program_fail;

    retval = (MOJOSHADER_glProgram *) Malloc(sizeof (MOJOSHADER_glProgram));
    if (retval == NULL)
        goto link_program_fail;
    memset(retval, '\0', sizeof (MOJOSHADER_glProgram));
    memset(retval->vertex_attrib_loc, 0xFF, sizeof(retval->vertex_attrib_loc));

    numregs = 0;
    if (vshader != NULL) numregs += vshader->parseData->uniform_count;
    if (pshader != NULL) numregs += pshader->parseData->uniform_count;
    if (numregs > 0)
    {
        const size_t len = sizeof (UniformMap) * numregs;
        retval->uniforms = (UniformMap *) Malloc(len);
        if (retval->uniforms == NULL)
            goto link_program_fail;
        memset(retval->uniforms, '\0', len);
    } // if

    retval->handle = program;
    retval->vertex = vshader;
    retval->fragment = pshader;
    retval->generation = ctx->generation - 1;
    retval->refcount = 1;

    if (vshader != NULL)
    {
        if (vshader->parseData->attribute_count > 0)
        {
            const int count = vshader->parseData->attribute_count;
            const size_t len = sizeof (AttributeMap) * count;
            retval->attributes = (AttributeMap *) Malloc(len);
            if (retval->attributes == NULL)
                goto link_program_fail;

            memset(retval->attributes, '\0', len);
            if (!lookup_attributes(retval))
                goto link_program_fail;
        } // if

        if (!lookup_uniforms(retval, vshader, &bound))
            goto link_program_fail;
        lookup_samplers(retval, vshader, &bound);
        lookup_outputs(retval, pshader);
        vshader->refcount++;
    } // if

    if (pshader != NULL)
    {
        if (!lookup_uniforms(retval, pshader, &bound))
            goto link_program_fail;
        lookup_samplers(retval, pshader, &bound);
        lookup_outputs(retval, pshader);
        pshader->refcount++;
    } // if

    if (!build_constants_lists(retval))
        goto link_program_fail;

    if (bound)  // reset the old binding.
        ctx->profileUseProgram(ctx->bound_program);

    ctx->profileFinalInitProgram(retval);

    return retval;

link_program_fail:
    if (retval != NULL)
    {
        Free(retval->vs_uniforms_float4);
        Free(retval->vs_uniforms_int4);
        Free(retval->vs_uniforms_bool);
        Free(retval->ps_uniforms_float4);
        Free(retval->ps_uniforms_int4);
        Free(retval->ps_uniforms_bool);
        Free(retval->uniforms);
        Free(retval->attributes);
        Free(retval);
    } // if

    if (program != 0)
        ctx->profileDeleteProgram(program);

    if (bound)
        ctx->profileUseProgram(ctx->bound_program);

    return NULL;
}